

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::executeRGBA8ColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,PixelBufferAccess *colorBuffer)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  deUint8 dVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  
  iVar1 = (colorBuffer->super_ConstPixelBufferAccess).m_pitch.m_data[1];
  iVar2 = (colorBuffer->super_ConstPixelBufferAccess).m_pitch.m_data[2];
  pvVar3 = (colorBuffer->super_ConstPixelBufferAccess).m_data;
  pfVar10 = &this->m_sampleRegister[0].blendedA;
  for (uVar9 = 0; uVar9 != 0x40; uVar9 = uVar9 + 1) {
    if (((SampleData *)(pfVar10 + -0x18))->isAlive == true) {
      uVar4 = (ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff;
      iVar7 = (int)((long)uVar4 / (long)numSamplesPerFragment) + fragNdxOffset;
      lVar5 = (long)(inputFragments[iVar7].pixelCoord.m_data[0] * iVar1) +
              ((long)uVar4 % (long)numSamplesPerFragment & 0xffffffffU) * 4;
      lVar8 = (long)(inputFragments[iVar7].pixelCoord.m_data[1] * iVar2);
      dVar6 = tcu::floatToU8(((Vec3 *)(pfVar10 + -3))->m_data[0]);
      *(deUint8 *)((long)pvVar3 + lVar8 + lVar5) = dVar6;
      dVar6 = tcu::floatToU8(pfVar10[-2]);
      *(deUint8 *)((long)pvVar3 + lVar8 + 1 + lVar5) = dVar6;
      dVar6 = tcu::floatToU8(pfVar10[-1]);
      *(deUint8 *)((long)pvVar3 + lVar8 + 2 + lVar5) = dVar6;
      dVar6 = tcu::floatToU8(*pfVar10);
      *(deUint8 *)((long)pvVar3 + lVar8 + 3 + lVar5) = dVar6;
    }
    pfVar10 = pfVar10 + 0x21;
  }
  return;
}

Assistant:

void FragmentProcessor::executeRGBA8ColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const tcu::PixelBufferAccess& colorBuffer)
{
	const int		fragStride	= 4;
	const int		xStride		= colorBuffer.getRowPitch();
	const int		yStride		= colorBuffer.getSlicePitch();
	deUint8* const	basePtr		= (deUint8*)colorBuffer.getDataPtr();

	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			const int			fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			deUint8*			dstPtr			= basePtr + fragSampleNdx*fragStride + frag.pixelCoord.x()*xStride + frag.pixelCoord.y()*yStride;

			dstPtr[0] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedRGB.x());
			dstPtr[1] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedRGB.y());
			dstPtr[2] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedRGB.z());
			dstPtr[3] = tcu::floatToU8(m_sampleRegister[regSampleNdx].blendedA);
		}
	}
}